

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O1

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex>::
set_pattern(ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this,
           string *pattern)

{
  pthread_mutex_t *__mutex;
  pointer pcVar1;
  formatter *pfVar2;
  int iVar3;
  pattern_formatter *this_00;
  string local_68;
  string local_48;
  
  __mutex = (pthread_mutex_t *)this->mutex_;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    this_00 = (pattern_formatter *)operator_new(0xa8);
    pcVar1 = (pattern->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + pattern->_M_string_length);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\n","");
    pattern_formatter::pattern_formatter(this_00,&local_48,local,&local_68);
    pfVar2 = (this->super_sink).formatter_._M_t.
             super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
             super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
             super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
    (this->super_sink).formatter_._M_t.
    super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
    super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
    super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)this_00;
    if (pfVar2 != (formatter *)0x0) {
      (*pfVar2->_vptr_formatter[1])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void set_pattern(const std::string &pattern) final
    {
        std::lock_guard<mutex_t> lock(mutex_);
        formatter_ = std::unique_ptr<spdlog::formatter>(new pattern_formatter(pattern));
    }